

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O0

int greatest_test_pre(char *name)

{
  int iVar1;
  unsigned_long uVar2;
  bool bVar3;
  greatest_prng *p;
  int match;
  greatest_run_info *g;
  char *name_local;
  
  greatest_buffer_test_name(name);
  iVar1 = greatest_name_match(greatest_info.name_buf,greatest_info.test_filter,1);
  bVar3 = false;
  if (iVar1 != 0) {
    iVar1 = greatest_name_match(greatest_info.name_buf,greatest_info.test_exclude,0);
    bVar3 = iVar1 == 0;
  }
  uVar2 = greatest_info.prng[1].count;
  if ((greatest_info.flags & 2) == 0) {
    if (((bVar3) && (((greatest_info.flags & 1) == 0 || (greatest_info.suite.failed == 0)))) &&
       ((greatest_info.prng[1].random_order == '\0' ||
        ((uVar2 = greatest_info.prng[1].count + 1, greatest_info.prng[1].initialized != '\0' &&
         (bVar3 = greatest_info.prng[1].count == greatest_info.prng[1].state,
         greatest_info.prng[1].count = uVar2, bVar3)))))) {
      greatest_info.suite.pre_test = clock();
      if (greatest_info.suite.pre_test != -1) {
        if (greatest_info.setup != (undefined1 *)0x0) {
          (*(code *)greatest_info.setup)(greatest_info.setup_udata);
        }
        greatest_info.prng[1].count_run = greatest_info.prng[1].count_run + 1;
        return 1;
      }
      fprintf(_stdout,"clock error: %s\n","g->suite.pre_test");
      exit(1);
    }
  }
  else if (bVar3) {
    fprintf(_stdout,"  %s\n",0x296540);
    uVar2 = greatest_info.prng[1].count;
  }
  greatest_info.prng[1].count = uVar2;
  greatest_info.name_suffix = (char *)0x0;
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}